

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

ecdh_key * ssh_ntru_new(ssh_kex *kex,_Bool is_server)

{
  undefined8 *puVar1;
  void *pvVar2;
  strbuf *psVar3;
  ecdh_key *peVar4;
  NTRUKeyPair *pNVar5;
  ecdh_key *peVar6;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,is_server) == 0) {
    puVar1 = (undefined8 *)safemalloc(1,0x18,0);
    puVar1[2] = &ssh_ntru_client_vt;
    peVar6 = (ecdh_key *)(puVar1 + 2);
    do {
      pNVar5 = ntru_keygen_attempt(0x2f9,0x11ef,0x11e);
    } while (pNVar5 == (NTRUKeyPair *)0x0);
    *puVar1 = pNVar5;
    peVar4 = ssh_ecdhkex_m_new(&ssh_ec_kex_curve25519,false);
    puVar1[1] = peVar4;
  }
  else {
    puVar1 = (undefined8 *)safemalloc(1,0x28,0);
    peVar6 = (ecdh_key *)(puVar1 + 4);
    puVar1[4] = &ssh_ntru_server_vt;
    pvVar2 = safemalloc(0x2f9,2,0);
    *puVar1 = pvVar2;
    psVar3 = strbuf_new_nm();
    puVar1[1] = psVar3;
    psVar3 = strbuf_new_nm();
    puVar1[2] = psVar3;
    ntru_gen_short((uint16_t *)*puVar1,0x2f9,0x11e);
    peVar4 = ssh_ecdhkex_m_new(&ssh_ec_kex_curve25519,false);
    puVar1[3] = peVar4;
  }
  return peVar6;
}

Assistant:

static ecdh_key *ssh_ntru_new(const ssh_kex *kex, bool is_server)
{
    if (is_server)
        return ssh_ntru_server_new();
    else
        return ssh_ntru_client_new();
}